

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_unittests.cc
# Opt level: O3

void __thiscall Simple_All_Test::TestBody(Simple_All_Test *this)

{
  int iVar1;
  pointer ppVar2;
  bool bVar3;
  const_iterator cVar4;
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *psVar5;
  value_type *pvVar6;
  value_type *pvVar7;
  uint uVar8;
  long lVar9;
  iterator iVar10;
  pointer piVar11;
  pointer ppVar12;
  pair<google::dense_hashtable_iterator<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>,_bool>
  p;
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  smap;
  sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  sset;
  bool local_279;
  int local_278;
  bool local_271;
  sparse_hashtable_const_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  local_270;
  internal local_228 [8];
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *local_220;
  pair<google::sparse_hashtable_const_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>,_bool>
  local_218;
  iterator local_1c8;
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_180;
  dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  local_130;
  sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  local_e0;
  sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  local_88;
  
  lVar9 = 0;
  google::
  sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  ::sparse_hashtable(&local_88,0,(hash<int> *)&local_180,(equal_to<int> *)&local_218,
                     (Identity *)&local_e0,(SetKey *)&local_130,
                     (libc_allocator_with_realloc<int> *)&local_270);
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::sparse_hashtable((sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                      *)&local_e0,0,(hash<int> *)&local_218,(equal_to<int> *)&local_270,
                     (SelectKey *)&local_130,(SetKey *)&local_180,
                     (libc_allocator_with_realloc<std::pair<const_int,_int>_> *)&local_1c8);
  local_130.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_deleted_
       = false;
  local_130.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  local_130.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_factor_ = 0.5;
  local_130.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_factor_ = 0.2;
  local_130.num_deleted = 0;
  local_130.num_elements = 0;
  local_130.num_buckets = 0x20;
  local_130.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_threshold_ = 0x10;
  local_130.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_threshold_ = 6;
  local_130.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  consider_shrink_ = false;
  local_180.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_deleted_
       = false;
  local_180.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  local_180.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_factor_ = 0.5;
  local_180.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_factor_ = 0.2;
  local_180.key_info.delkey = 0;
  local_180.key_info.empty_key = 0;
  local_180.num_deleted = 0;
  local_180.num_elements = 0;
  local_180.num_buckets = 0x20;
  local_180.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_threshold_ = 0x10;
  local_180.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_threshold_ = 6;
  local_180.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  consider_shrink_ = false;
  local_130.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_empty_ =
       true;
  local_130.key_info.delkey = 0;
  local_130.key_info.empty_key = -1;
  local_130.table = (pointer)malloc(0x80);
  *local_130.table = -1;
  local_130.table[1] = -1;
  local_130.table[2] = -1;
  local_130.table[3] = -1;
  local_130.table[4] = -1;
  local_130.table[5] = -1;
  local_130.table[6] = -1;
  local_130.table[7] = -1;
  local_130.table[8] = -1;
  local_130.table[9] = -1;
  local_130.table[10] = -1;
  local_130.table[0xb] = -1;
  local_130.table[0xc] = -1;
  local_130.table[0xd] = -1;
  local_130.table[0xe] = -1;
  local_130.table[0xf] = -1;
  local_130.table[0x10] = -1;
  local_130.table[0x11] = -1;
  local_130.table[0x12] = -1;
  local_130.table[0x13] = -1;
  local_130.table[0x14] = -1;
  local_130.table[0x15] = -1;
  local_130.table[0x16] = -1;
  local_130.table[0x17] = -1;
  local_130.table[0x18] = -1;
  local_130.table[0x19] = -1;
  local_130.table[0x1a] = -1;
  local_130.table[0x1b] = -1;
  local_130.table[0x1c] = -1;
  local_130.table[0x1d] = -1;
  local_130.table[0x1e] = -1;
  local_130.table[0x1f] = -1;
  local_180.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_empty_ =
       true;
  local_180.key_info.empty_key = -1;
  local_180.table = (pointer)malloc(0x100);
  do {
    ppVar2 = local_180.table + lVar9;
    ppVar2->first = -1;
    ppVar2->second = 0;
    ppVar2[1].first = -1;
    ppVar2[1].second = 0;
    lVar9 = lVar9 + 2;
  } while (lVar9 != 0x20);
  local_270.ht = (sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                  *)((ulong)local_270.ht._4_4_ << 0x20);
  do {
    google::
    sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::insert(&local_218,
             (sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
              *)&local_88,(value_type *)&local_270);
    iVar1 = (int)local_270.ht;
    pvVar6 = google::
             sparse_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::sparse_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                         *)&local_e0,(key_type *)&local_270);
    pvVar6->second = iVar1 + 1;
    local_1c8.ht._0_4_ = (int)local_270.ht + 5;
    google::
    dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::resize_delta(&local_130,1);
    google::
    dense_hashtable<int,int,std::hash<int>,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::Identity,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<int>>
    ::insert_noresize<int_const&,int>
              ((pair<google::dense_hashtable_iterator<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>,_bool>
                *)&local_218,
               (dense_hashtable<int,int,std::hash<int>,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::Identity,google::dense_hash_set<int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<int>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<int>>
                *)&local_130,(int *)&local_1c8,(int *)&local_1c8);
    iVar1 = (int)local_270.ht;
    local_218.first.ht._0_4_ = (int)local_270.ht + 5;
    pvVar7 = google::
             dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
             ::find_or_insert<int,int>
                       ((dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                         *)&local_180,(int *)&local_218);
    pvVar7->second = iVar1 + 6;
    iVar1 = (int)local_270.ht;
    local_270.ht = (sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                    *)CONCAT44(local_270.ht._4_4_,(int)local_270.ht + 10);
  } while (iVar1 < 0x5a);
  local_278 = 0;
  do {
    google::
    sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::find<int>(&local_218.first,&local_88,&local_278);
    local_270.pos.row_begin._M_current =
         local_88.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_270.pos.row_end._M_current =
         local_88.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_270.pos.row_current._M_current =
         local_88.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_270.pos.col_current = (const_nonempty_iterator)0x0;
    local_270.end.row_begin._M_current =
         local_88.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_270.end.row_end._M_current =
         local_88.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_270.end.row_current._M_current =
         local_88.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_270.end.col_current = (const_nonempty_iterator)0x0;
    local_270.ht = &local_88;
    google::
    sparse_hashtable_const_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::advance_past_deleted(&local_270);
    local_228[0] = (internal)0x1;
    if (((local_218.first.pos.row_begin._M_current == local_270.pos.row_begin._M_current) &&
        (local_218.first.pos.row_end._M_current == local_270.pos.row_end._M_current)) &&
       (local_218.first.pos.row_current._M_current == local_270.pos.row_current._M_current)) {
      if (local_218.first.pos.row_current._M_current == local_218.first.pos.row_end._M_current) {
        local_228[0] = (internal)0x0;
      }
      else {
        local_228[0] = (internal)(local_218.first.pos.col_current != local_270.pos.col_current);
      }
    }
    uVar8 = local_278 * -0x33333333 + 0x19999998;
    local_279 = (uVar8 >> 1 | (uint)((uVar8 & 1) != 0) << 0x1f) < 0x19999999;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_1c8,"sset.find(i) != sset.end()","(i % 10) == 0",(bool *)local_228
               ,&local_279);
    iVar10._M_current = local_1c8.pos.row_begin._M_current;
    if ((char)local_1c8.ht == '\0') {
      testing::Message::Message((Message *)&local_218);
      if (local_1c8.pos.row_begin._M_current ==
          (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)0x0) {
        ppVar12 = (pointer)0xaf1463;
      }
      else {
        ppVar12 = (local_1c8.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_270,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x3c,(char *)ppVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_270,(Message *)&local_218);
LAB_005fba1f:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_270);
      iVar10._M_current = local_1c8.pos.row_begin._M_current;
      if ((long *)CONCAT44(local_218.first.ht._4_4_,(int)local_218.first.ht) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_218.first.ht._4_4_,(int)local_218.first.ht) + 8))();
        iVar10._M_current = local_1c8.pos.row_begin._M_current;
      }
LAB_005fba41:
      if (iVar10._M_current !=
          (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)0x0) {
        if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *)(iVar10._M_current)->group != iVar10._M_current + 1) {
          operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                           *)(iVar10._M_current)->group);
        }
        operator_delete(iVar10._M_current);
      }
      break;
    }
    if (local_1c8.pos.row_begin._M_current !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)0x0) {
      if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)(local_1c8.pos.row_begin._M_current)->group != local_1c8.pos.row_begin._M_current + 1)
      {
        operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)(local_1c8.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar10._M_current);
    }
    google::
    sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find<int>((iterator *)&local_218,
                (sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                 *)&local_e0,&local_278);
    local_270.pos.row_begin._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_270.pos.row_end._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_270.pos.row_current._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_270.pos.col_current = (const_nonempty_iterator)0x0;
    local_270.end.row_begin._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_270.end.row_end._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_270.end.row_current._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_270.end.col_current = (const_nonempty_iterator)0x0;
    local_270.ht = &local_e0;
    google::
    sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::advance_past_deleted
              ((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)&local_270);
    local_228[0] = (internal)0x1;
    if (((local_218.first.pos.row_begin._M_current == local_270.pos.row_begin._M_current) &&
        (local_218.first.pos.row_end._M_current == local_270.pos.row_end._M_current)) &&
       (local_218.first.pos.row_current._M_current == local_270.pos.row_current._M_current)) {
      if (local_218.first.pos.row_current._M_current == local_218.first.pos.row_end._M_current) {
        local_228[0] = (internal)0x0;
      }
      else {
        local_228[0] = (internal)(local_218.first.pos.col_current != local_270.pos.col_current);
      }
    }
    uVar8 = local_278 * -0x33333333 + 0x19999998;
    local_279 = (uVar8 >> 1 | (uint)((uVar8 & 1) != 0) << 0x1f) < 0x19999999;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_1c8,"smap.find(i) != smap.end()","(i % 10) == 0",(bool *)local_228
               ,&local_279);
    iVar10._M_current = local_1c8.pos.row_begin._M_current;
    if ((char)local_1c8.ht == '\0') {
      testing::Message::Message((Message *)&local_218);
      if (local_1c8.pos.row_begin._M_current ==
          (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)0x0) {
        ppVar12 = (pointer)0xaf1463;
      }
      else {
        ppVar12 = (local_1c8.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_270,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x3d,(char *)ppVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_270,(Message *)&local_218);
      goto LAB_005fba1f;
    }
    if (local_1c8.pos.row_begin._M_current !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)0x0) {
      if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)(local_1c8.pos.row_begin._M_current)->group != local_1c8.pos.row_begin._M_current + 1)
      {
        operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)(local_1c8.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar10._M_current);
    }
    google::
    sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find<int>((iterator *)&local_218,
                (sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                 *)&local_e0,&local_278);
    local_270.pos.row_begin._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_270.pos.row_end._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_270.pos.row_current._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_270.pos.col_current = (const_nonempty_iterator)0x0;
    local_270.end.row_begin._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_270.end.row_end._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_270.end.row_current._M_current =
         local_e0.table.groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_270.end.col_current = (const_nonempty_iterator)0x0;
    local_270.ht = &local_e0;
    google::
    sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::advance_past_deleted
              ((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)&local_270);
    if (((local_218.first.pos.row_begin._M_current == local_270.pos.row_begin._M_current) &&
        (local_218.first.pos.row_end._M_current == local_270.pos.row_end._M_current)) &&
       ((local_218.first.pos.row_current._M_current == local_270.pos.row_current._M_current &&
        ((local_218.first.pos.row_current._M_current == local_218.first.pos.row_end._M_current ||
         (local_218.first.pos.col_current == local_270.pos.col_current)))))) {
      local_279 = false;
    }
    else {
      google::
      sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::find<int>(&local_1c8,
                  (sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *)&local_e0,&local_278);
      local_279 = (local_1c8.pos.col_current)->second == local_278 + 1;
    }
    uVar8 = local_278 * -0x33333333 + 0x19999998;
    local_271 = (uVar8 >> 1 | (uint)((uVar8 & 1) != 0) << 0x1f) < 0x19999999;
    testing::internal::CmpHelperEQ<bool,bool>
              (local_228,"smap.find(i) != smap.end() && smap.find(i)->second == i + 1",
               "(i % 10) == 0",&local_279,&local_271);
    psVar5 = local_220;
    if (local_228[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_218);
      if (local_220 ==
          (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)0x0) {
        ppVar12 = (pointer)0xaf1463;
      }
      else {
        ppVar12 = local_220->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_270,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x3f,(char *)ppVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_270,(Message *)&local_218);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_270);
      iVar10._M_current = local_220;
      if ((long *)CONCAT44(local_218.first.ht._4_4_,(int)local_218.first.ht) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_218.first.ht._4_4_,(int)local_218.first.ht) + 8))();
        iVar10._M_current = local_220;
      }
      goto LAB_005fba41;
    }
    if (local_220 !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)0x0) {
      if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)local_220->group != local_220 + 1) {
        operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)local_220->group);
      }
      operator_delete(psVar5);
    }
    google::
    dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::find<int>((const_iterator *)&local_218,&local_130,&local_278);
    local_1c8.ht._0_4_ =
         CONCAT31(local_1c8.ht._1_3_,
                  local_218.first.pos.row_begin._M_current !=
                  (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *
                  )(local_130.table + local_130.num_buckets));
    local_228[0] = (internal)(local_278 % 10 == 5);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_270,"dset.find(i) != dset.end()","(i % 10) == 5",
               (bool *)&local_1c8,(bool *)local_228);
    cVar4._M_current = local_270.pos.row_begin._M_current;
    if ((char)local_270.ht == '\0') {
      testing::Message::Message((Message *)&local_218);
      if (local_270.pos.row_begin._M_current ==
          (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)0x0) {
        piVar11 = (pointer)0xaf1463;
      }
      else {
        piVar11 = (local_270.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x40,(char *)piVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)&local_218);
LAB_005fb9ca:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
      iVar10._M_current =
           (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            *)local_270.pos.row_begin._M_current;
      if ((long *)CONCAT44(local_218.first.ht._4_4_,(int)local_218.first.ht) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_218.first.ht._4_4_,(int)local_218.first.ht) + 8))();
        iVar10._M_current =
             (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
              *)local_270.pos.row_begin._M_current;
      }
      goto LAB_005fba41;
    }
    if (local_270.pos.row_begin._M_current !=
        (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)0x0) {
      if ((sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
          (local_270.pos.row_begin._M_current)->group != local_270.pos.row_begin._M_current + 1) {
        operator_delete((sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                         *)(local_270.pos.row_begin._M_current)->group);
      }
      operator_delete(cVar4._M_current);
    }
    google::
    dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find<int>((iterator *)&local_218,&local_180,&local_278);
    local_1c8.ht._0_4_ =
         CONCAT31(local_1c8.ht._1_3_,
                  local_218.first.pos.row_begin._M_current !=
                  (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *
                  )(local_180.table + local_180.num_buckets));
    local_228[0] = (internal)(local_278 % 10 == 5);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_270,"dmap.find(i) != dmap.end()","(i % 10) == 5",
               (bool *)&local_1c8,(bool *)local_228);
    cVar4._M_current = local_270.pos.row_begin._M_current;
    if ((char)local_270.ht == '\0') {
      testing::Message::Message((Message *)&local_218);
      if (local_270.pos.row_begin._M_current ==
          (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)0x0) {
        piVar11 = (pointer)0xaf1463;
      }
      else {
        piVar11 = (local_270.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x41,(char *)piVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)&local_218);
      goto LAB_005fb9ca;
    }
    if (local_270.pos.row_begin._M_current !=
        (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)0x0) {
      if ((sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
          (local_270.pos.row_begin._M_current)->group != local_270.pos.row_begin._M_current + 1) {
        operator_delete((sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                         *)(local_270.pos.row_begin._M_current)->group);
      }
      operator_delete(cVar4._M_current);
    }
    google::
    dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find<int>((iterator *)&local_218,&local_180,&local_278);
    if (local_218.first.pos.row_begin._M_current ==
        (sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
        (local_180.table + local_180.num_buckets)) {
      local_228[0] = (internal)0x0;
    }
    else {
      google::
      dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::find<int>((iterator *)&local_270,&local_180,&local_278);
      local_228[0] = (internal)
                     (*(int *)((long)&(local_270.pos.row_begin._M_current)->group + 4) ==
                     local_278 + 1);
    }
    local_279 = local_278 % 10 == 5;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_1c8,"dmap.find(i) != dmap.end() && dmap.find(i)->second == i + 1",
               "(i % 10) == 5",(bool *)local_228,&local_279);
    iVar10._M_current = local_1c8.pos.row_begin._M_current;
    if ((char)local_1c8.ht == '\0') {
      testing::Message::Message((Message *)&local_218);
      if (local_1c8.pos.row_begin._M_current ==
          (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)0x0) {
        ppVar12 = (pointer)0xaf1463;
      }
      else {
        ppVar12 = (local_1c8.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_270,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/simple_unittests.cc"
                 ,0x43,(char *)ppVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_270,(Message *)&local_218);
      goto LAB_005fba1f;
    }
    if (local_1c8.pos.row_begin._M_current !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)0x0) {
      if ((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)(local_1c8.pos.row_begin._M_current)->group != local_1c8.pos.row_begin._M_current + 1)
      {
        operator_delete((sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)(local_1c8.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar10._M_current);
    }
    iVar1 = local_278 + 1;
    bVar3 = local_278 < 99;
    local_278 = iVar1;
  } while (bVar3);
  if (local_180.table != (pointer)0x0) {
    free(local_180.table);
  }
  if (local_130.table != (pointer)0x0) {
    free(local_130.table);
  }
  std::
  vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>
             *)&local_e0.table);
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
  ::~vector(&local_88.table.groups);
  return;
}

Assistant:

TEST(Simple, All) {
  google::sparse_hash_set<int> sset;
  google::sparse_hash_map<int, int> smap;
  google::dense_hash_set<int> dset;
  google::dense_hash_map<int, int> dmap;
  dset.set_empty_key(-1);
  dmap.set_empty_key(-1);

  for (int i = 0; i < 100; i += 10) {  // go by tens
    sset.insert(i);
    smap[i] = i + 1;
    dset.insert(i + 5);
    dmap[i + 5] = i + 6;
  }

  for (int i = 0; i < 100; i++) {
    ASSERT_EQ(sset.find(i) != sset.end(), (i % 10) == 0);
    ASSERT_EQ(smap.find(i) != smap.end(), (i % 10) == 0);
    ASSERT_EQ(smap.find(i) != smap.end() && smap.find(i)->second == i + 1,
              (i % 10) == 0);
    ASSERT_EQ(dset.find(i) != dset.end(), (i % 10) == 5);
    ASSERT_EQ(dmap.find(i) != dmap.end(), (i % 10) == 5);
    ASSERT_EQ(dmap.find(i) != dmap.end() && dmap.find(i)->second == i + 1,
              (i % 10) == 5);
  }
}